

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# placalc.cpp
# Opt level: O1

void __thiscall placalc::LoadPostLossAmplificationFactors(placalc *this,float secondaryFactor)

{
  double dVar1;
  uint uVar2;
  FILE *__stream;
  size_t sVar3;
  mapped_type *pmVar4;
  size_t sVar5;
  iterator iVar6;
  char *this_00;
  placalc *this_01;
  int iVar7;
  float extraout_XMM0_Da;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM1_Qb;
  event_count ec;
  event_amplification ea;
  amplification_factor af;
  int opts;
  undefined4 uStack_e0;
  int iStack_dc;
  float fStack_d8;
  uint uStack_d4;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  int iStack_c0;
  int iStack_bc;
  key_type kStack_b8;
  float fStack_b0;
  undefined4 uStack_ac;
  undefined4 uStack_a8;
  undefined4 uStack_a4;
  int local_58;
  int local_54;
  key_type local_50;
  int local_48;
  float local_44;
  double local_40;
  undefined1 local_34 [4];
  
  this_00 = "static/lossfactors.bin";
  __stream = fopen("static/lossfactors.bin","rb");
  if (__stream != (FILE *)0x0) {
    sVar3 = fread(local_34,4,1,__stream);
    if ((sVar3 != 0) && (sVar3 = fread(&local_58,8,1,__stream), sVar3 != 0)) {
      local_40 = (double)secondaryFactor;
      do {
        local_50.event_id = local_58;
        iVar7 = local_54;
        if (local_54 != 0) {
          do {
            sVar3 = fread(&local_48,8,1,__stream);
            if (sVar3 == 0) {
              return;
            }
            local_50.amplification_id = local_48;
            dVar1 = ((double)local_44 + -1.0) * local_40;
            pmVar4 = std::__detail::
                     _Map_base<event_amplification,_std::pair<const_event_amplification,_float>,_std::allocator<std::pair<const_event_amplification,_float>_>,_std::__detail::_Select1st,_std::equal_to<event_amplification>,_placalc::hash_event_amplification,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                     ::operator[]((_Map_base<event_amplification,_std::pair<const_event_amplification,_float>,_std::allocator<std::pair<const_event_amplification,_float>_>,_std::__detail::_Select1st,_std::equal_to<event_amplification>,_placalc::hash_event_amplification,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                   *)factors_,&local_50);
            *pmVar4 = (float)(dVar1 + 1.0);
            iVar7 = iVar7 + -1;
          } while (iVar7 != 0);
          if (sVar3 == 0) {
            return;
          }
        }
        sVar3 = fread(&local_58,8,1,__stream);
      } while (sVar3 != 0);
    }
    return;
  }
  LoadPostLossAmplificationFactors();
  uStack_d0 = in_XMM1_Qa;
  uStack_c8 = in_XMM1_Qb;
  fStack_b0 = extraout_XMM0_Da;
  LoadItemToAmplification();
  if (((float)uStack_d0 == 0.0) && (!NAN((float)uStack_d0))) {
    LoadPostLossAmplificationFactors((placalc *)this_00,fStack_b0);
  }
  uStack_d4 = 0;
  fread(&uStack_d4,4,1,_stdin);
  this_01 = (placalc *)(ulong)uStack_d4;
  uVar2 = 0x1000000;
  if ((uStack_d4 >> 0x18 & 1) == 0) {
    uVar2 = uStack_d4 & 0x2000000;
  }
  if ((uVar2 != 0x1000000) && (uVar2 != 0x2000000)) {
    doit(this_01);
    if (*(void **)this_01 == (void *)0x0) {
      return;
    }
    operator_delete(*(void **)this_01);
    return;
  }
  fwrite(&uStack_d4,4,1,_stdout);
  uStack_e0 = 0;
  sVar3 = fread(&uStack_e0,4,1,_stdin);
  if (sVar3 == 0) {
    doit((placalc *)&uStack_e0);
  }
  fwrite(&uStack_e0,4,1,_stdout);
  fStack_b0 = (float)(~-(uint)((float)uStack_d0 == 0.0) & (uint)(float)uStack_d0 |
                     -(uint)((float)uStack_d0 == 0.0) & 0x3f800000);
  uStack_ac = uStack_d0._4_4_;
  uStack_a8 = (undefined4)uStack_c8;
  uStack_a4 = uStack_c8._4_4_;
  do {
    if (sVar3 == 0) {
      return;
    }
    sVar5 = fread(&iStack_c0,8,1,_stdin);
    if (sVar5 == 0) {
      sVar3 = 0;
    }
    else {
      fwrite(&iStack_c0,8,1,_stdout);
      kStack_b8.event_id = iStack_c0;
      kStack_b8.amplification_id = *(int *)(item_to_amplification_ + (long)iStack_bc * 4);
      iVar6 = std::
              _Hashtable<event_amplification,_std::pair<const_event_amplification,_float>,_std::allocator<std::pair<const_event_amplification,_float>_>,_std::__detail::_Select1st,_std::equal_to<event_amplification>,_placalc::hash_event_amplification,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find((_Hashtable<event_amplification,_std::pair<const_event_amplification,_float>,_std::allocator<std::pair<const_event_amplification,_float>_>,_std::__detail::_Select1st,_std::equal_to<event_amplification>,_placalc::hash_event_amplification,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                      *)factors_,&kStack_b8);
      uStack_d0 = CONCAT44(uStack_d0._4_4_,fStack_b0);
      if (iVar6.super__Node_iterator_base<std::pair<const_event_amplification,_float>,_true>._M_cur
          != (__node_type *)0x0) {
        uStack_d0 = CONCAT44(uStack_d0._4_4_,
                             *(undefined4 *)
                              ((long)iVar6.
                                     super__Node_iterator_base<std::pair<const_event_amplification,_float>,_true>
                                     ._M_cur + 0x10));
      }
      do {
        sVar3 = fread(&iStack_dc,8,1,_stdin);
        if (sVar3 == 0) break;
        fStack_d8 = fStack_d8 * (float)uStack_d0;
        fwrite(&iStack_dc,8,1,_stdout);
      } while (iStack_dc != 0);
    }
    if (sVar5 == 0) {
      return;
    }
  } while( true );
}

Assistant:

void LoadPostLossAmplificationFactors(const float secondaryFactor) {

    FILE *fin = fopen(PLAFACTORS_FILE, "rb");
    if (fin == nullptr) {
      fprintf(stderr, "FATAL: %s: Error opening file %s\n", __func__,
	      PLAFACTORS_FILE);
      exit(EXIT_FAILURE);
    }

    int opts;
    size_t i = fread(&opts, sizeof(opts), 1, fin);

    event_count ec;
    amplification_factor af;
    while (i != 0) {
      i = fread(&ec, sizeof(ec), 1, fin);
      if (i == 0) break;
      event_amplification ea;
      ea.event_id = ec.event_id;
      for (int amplification = 0; amplification != ec.count; ++amplification) {
	i = fread(&af, sizeof(af), 1, fin);
	if (i == 0) break;
	ea.amplification_id = af.amplification_id;
	factors_[ea] = 1. + (af.factor - 1.) * secondaryFactor;
      }
    }

  }